

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_imad_instruction(Impl *impl,CallInst *instruction)

{
  Id IVar1;
  Type *type;
  Operation *this;
  Value *pVVar2;
  Operation *this_00;
  Operation *add;
  Operation *mul;
  CallInst *instruction_local;
  Impl *impl_local;
  
  type = LLVMBC::Value::getType((Value *)instruction);
  IVar1 = Converter::Impl::get_type_id(impl,type,0);
  this = Converter::Impl::allocate(impl,OpIMul,IVar1);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  Operation::add_id(this,IVar1);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  Operation::add_id(this,IVar1);
  Converter::Impl::add(impl,this,false);
  this_00 = Converter::Impl::allocate(impl,OpIAdd,(Value *)instruction);
  Operation::add_id(this_00,this->id);
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
  IVar1 = Converter::Impl::get_id_for_value(impl,pVVar2,0);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  return true;
}

Assistant:

bool emit_imad_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// FIXME: Do we need to deal with intermediate mul overflow here somehow?

	Operation *mul = impl.allocate(spv::OpIMul, impl.get_type_id(instruction->getType()));
	mul->add_id(impl.get_id_for_value(instruction->getOperand(1)));
	mul->add_id(impl.get_id_for_value(instruction->getOperand(2)));
	impl.add(mul);

	Operation *add = impl.allocate(spv::OpIAdd, instruction);
	add->add_id(mul->id);
	add->add_id(impl.get_id_for_value(instruction->getOperand(3)));
	impl.add(add);
	return true;
}